

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

TestInfo * __thiscall testing::TestCase::GetMutableTestInfo(TestCase *this,int i)

{
  pointer piVar1;
  long lVar2;
  TestInfo *pTVar3;
  long in_FS_OFFSET;
  
  if (((i < 0) ||
      (piVar1 = (this->test_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start,
      (int)((ulong)((long)(this->test_indices_).super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)piVar1) >> 2) <= i)) ||
     (lVar2 = (long)piVar1[(uint)i], lVar2 < 0)) {
    pTVar3 = (TestInfo *)0x0;
  }
  else {
    pTVar3 = (this->test_info_list_).
             super__Vector_base<testing::TestInfo_*,_std::allocator<testing::TestInfo_*>_>._M_impl.
             super__Vector_impl_data._M_start[lVar2];
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return pTVar3;
  }
  __stack_chk_fail();
}

Assistant:

TestInfo* TestCase::GetMutableTestInfo(int i) {
  const int index = GetElementOr(test_indices_, i, -1);
  return index < 0 ? NULL : test_info_list_[index];
}